

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  char cVar1;
  uchar uVar2;
  CURLcode CVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  size_t padding;
  long lVar9;
  long lVar10;
  long lVar11;
  char cVar12;
  ulong uVar13;
  size_t sVar14;
  uchar *puVar15;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar4 = strlen(src);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar4 & 3) == 0 && sVar4 != 0) {
    for (lVar10 = 0; src[lVar10] != '\0'; lVar10 = lVar10 + 1) {
      if (src[lVar10] == '=') {
        lVar6 = (ulong)(src[lVar10 + 1] == '=') + 1;
        goto LAB_0010453c;
      }
    }
    lVar6 = 0;
LAB_0010453c:
    if (sVar4 - lVar6 == lVar10) {
      uVar13 = sVar4 >> 2;
      sVar14 = uVar13 * 3 - lVar6;
      puVar5 = (uchar *)(*Curl_cmalloc)(sVar14 + 1);
      if (puVar5 == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar10 = 0;
        puVar15 = puVar5;
        do {
          uVar8 = 0;
          lVar6 = 0;
          lVar9 = 0;
          pcVar7 = src;
          do {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar8 = uVar8 << 6;
              lVar9 = lVar9 + 1;
            }
            else {
              lVar11 = 0;
              if (cVar1 == 'A') {
                cVar12 = 'A';
              }
              else {
                do {
                  cVar12 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar11 + 1];
                  lVar11 = lVar11 + 1;
                  if (cVar12 == '\0') break;
                } while (cVar12 != cVar1);
              }
              if (cVar12 != cVar1) goto LAB_00104667;
              uVar8 = uVar8 * 0x40 + lVar11;
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 != 4);
          if (lVar9 == 1) {
LAB_0010460a:
            uVar2 = curlx_ultouc(uVar8 >> 8 & 0xff);
            puVar15[1] = uVar2;
          }
          else if (lVar9 == 0) {
            uVar2 = curlx_ultouc(uVar8 & 0xff);
            puVar15[2] = uVar2;
            goto LAB_0010460a;
          }
          uVar2 = curlx_ultouc(uVar8 >> 0x10 & 0xff);
          *puVar15 = uVar2;
          if (lVar9 == 3) {
LAB_00104667:
            (*Curl_cfree)(puVar5);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar15 = puVar15 + (3 - lVar9);
          src = src + 4;
          lVar10 = lVar10 + 1;
        } while (lVar10 != uVar13 + (uVar13 == 0));
        *puVar15 = '\0';
        *outptr = puVar5;
        *outlen = sVar14;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t length = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  while((src[length] != '=') && src[length])
    length++;

  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    padding++;
    if(src[length + 1] == '=')
      padding++;
  }

  /* Check the = padding characters weren't part way through the input */
  if(length + padding != srclen)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a zero terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}